

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O1

void slang::ast::getHierarchicalPathImpl(Symbol *symbol,FormatBuffer *buffer)

{
  SymbolKind SVar1;
  int iVar2;
  Symbol *symbol_00;
  size_t sVar3;
  SVInt *this;
  Compilation *pCVar4;
  FormatBuffer *this_00;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  Scope *pSVar8;
  size_type sVar9;
  GenerateBlockArraySymbol *array;
  string_view text;
  string_view text_00;
  string_view fmt;
  string_view text_01;
  format_args args;
  SmallVector<slang::ConstantRange,_8UL> instanceDimVec;
  anon_class_24_3_8c777969 addName;
  anon_class_1_0_00000001 local_d9;
  FormatBuffer *local_d8;
  undefined1 local_d0 [24];
  char local_b8 [64];
  string_view local_78;
  anon_class_24_3_8c777969 local_60;
  ulong local_48 [3];
  
  pSVar8 = symbol->parentScope;
  if (pSVar8 == (Scope *)0x0 || symbol->kind != InstanceBody) {
    if (pSVar8 == (Scope *)0x0) {
      pSVar8 = (Scope *)0x0;
    }
    else if (symbol->kind == CheckerInstanceBody) goto LAB_0030a61f;
  }
  else {
LAB_0030a61f:
    symbol = (Symbol *)symbol[1].originatingSyntax;
    pSVar8 = (((GenerateBlockArraySymbol *)symbol)->super_Symbol).parentScope;
  }
  local_78._M_len = 0;
  local_78._M_str = (char *)0x0;
  local_d8 = buffer;
  if ((pSVar8 != (Scope *)0x0) &&
     (symbol_00 = pSVar8->thisSym, (symbol_00->kind | Definition) != CompilationUnit)) {
    getHierarchicalPathImpl(symbol_00,buffer);
    if (((ulong)symbol_00->kind < 0x33) &&
       ((0x4000000c00000U >> ((ulong)symbol_00->kind & 0x3f) & 1) != 0)) {
      local_78._M_str = "::";
      local_78._M_len = 2;
    }
    else {
      local_78._M_str = ".";
      local_78._M_len = 1;
    }
  }
  local_60.separator = &local_78;
  local_60.buffer = local_d8;
  local_60.needsEscaping = &local_d9;
  sVar3 = (((GenerateBlockArraySymbol *)symbol)->super_Symbol).name._M_len;
  if (sVar3 != 0) {
    text._M_str = (((GenerateBlockArraySymbol *)symbol)->super_Symbol).name._M_str;
    text._M_len = sVar3;
    getHierarchicalPathImpl::anon_class_24_3_8c777969::operator()(&local_60,text);
  }
  this_00 = local_d8;
  SVar1 = (((GenerateBlockArraySymbol *)symbol)->super_Symbol).kind;
  if ((int)SVar1 < 0x38) {
    if (SVar1 == Instance) {
LAB_0030a7c4:
      if ((((GenerateBlockArraySymbol *)symbol)->super_Scope).thisSym == (Symbol *)0x0) {
        return;
      }
      local_d0._0_8_ = local_b8;
      local_d0._8_8_ = 0;
      local_d0._16_8_ = 8;
      InstanceSymbolBase::getArrayDimensions
                ((InstanceSymbolBase *)symbol,(SmallVectorBase<slang::ConstantRange> *)local_d0);
      uVar6 = local_d0._8_8_;
      uVar5 = local_d0._0_8_;
      if (local_d0._8_8_ != 0) {
        pCVar4 = (((GenerateBlockArraySymbol *)symbol)->super_Scope).compilation;
        sVar9 = 0;
        do {
          iVar7 = *(int *)(uVar5 + sVar9 * 8);
          iVar2 = *(int *)(uVar5 + sVar9 * 8 + 4);
          if (iVar2 < iVar7) {
            iVar7 = iVar2;
          }
          local_48[0] = (ulong)(uint)(iVar7 + *(int *)((long)&(pCVar4->super_BumpAllocator).head +
                                                      sVar9 * 4));
          fmt.size_ = 4;
          fmt.data_ = "[{}]";
          args.field_1.values_ = (value<fmt::v11::context> *)local_48;
          args.desc_ = 1;
          ::fmt::v11::detail::vformat_to((buffer<char> *)local_d8,fmt,args,(locale_ref)0x0);
          sVar9 = sVar9 + 1;
        } while (uVar6 != sVar9);
      }
      if ((char *)local_d0._0_8_ == local_b8) {
        return;
      }
      operator_delete((void *)local_d0._0_8_);
      return;
    }
    if (SVar1 != GenerateBlock) {
      return;
    }
    this = (SVInt *)(((GenerateBlockArraySymbol *)symbol)->entries)._M_extent._M_extent_value;
    if (this != (SVInt *)0x0) {
      ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)local_d8,"[","");
      SVInt::toString_abi_cxx11_((string *)local_d0,this,Decimal,false,0xffffff);
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)this_00,(char *)local_d0._0_8_,
                 (char *)(local_d0._0_8_ + local_d0._8_8_));
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)local_d8,"]","");
      return;
    }
    if ((((GenerateBlockArraySymbol *)symbol)->super_Symbol).name._M_len != 0) {
      return;
    }
    GenerateBlockSymbol::getExternalName_abi_cxx11_
              ((string *)local_d0,(GenerateBlockSymbol *)symbol);
    text_01._M_str = (char *)local_d0._0_8_;
    text_01._M_len = local_d0._8_8_;
    getHierarchicalPathImpl::anon_class_24_3_8c777969::operator()(&local_60,text_01);
  }
  else {
    if (SVar1 == CheckerInstance) goto LAB_0030a7c4;
    if (SVar1 != GenerateBlockArray) {
      return;
    }
    if ((((GenerateBlockArraySymbol *)symbol)->super_Symbol).name._M_len != 0) {
      return;
    }
    GenerateBlockArraySymbol::getExternalName_abi_cxx11_
              ((string *)local_d0,(GenerateBlockArraySymbol *)symbol);
    text_00._M_str = (char *)local_d0._0_8_;
    text_00._M_len = local_d0._8_8_;
    getHierarchicalPathImpl::anon_class_24_3_8c777969::operator()(&local_60,text_00);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  return;
}

Assistant:

static void getHierarchicalPathImpl(const Symbol& symbol, FormatBuffer& buffer) {
    auto scope = symbol.getParentScope();
    auto current = &symbol;
    if (scope && symbol.kind == SymbolKind::InstanceBody) {
        current = symbol.as<InstanceBodySymbol>().parentInstance;
        SLANG_ASSERT(current);

        scope = current->getParentScope();
    }
    else if (scope && symbol.kind == SymbolKind::CheckerInstanceBody) {
        current = symbol.as<CheckerInstanceBodySymbol>().parentInstance;
        SLANG_ASSERT(current);

        scope = current->getParentScope();
    }

    std::string_view separator;
    if (scope) {
        auto& parent = scope->asSymbol();
        if (parent.kind != SymbolKind::Root && parent.kind != SymbolKind::CompilationUnit) {
            getHierarchicalPathImpl(parent, buffer);
            if (parent.kind == SymbolKind::Package || parent.kind == SymbolKind::ClassType ||
                parent.kind == SymbolKind::CovergroupType) {
                separator = "::"sv;
            }
            else {
                separator = "."sv;
            }
        }
    }

    auto needsEscaping = [](std::string_view text) {
        if (!text.empty()) {
            if (!isValidCIdChar(text[0]) || isDecimalDigit(text[0]))
                return true;

            for (size_t i = 1; i < text.length(); i++) {
                if (!isValidCIdChar(text[i]) && text[i] != '$')
                    return true;
            }
        }
        return false;
    };

    auto addName = [&](std::string_view text) {
        if (!separator.empty())
            buffer.append(separator);

        // If the name requires escaping add that here.
        if (needsEscaping(text))
            buffer.format("\\{} ", text);
        else
            buffer.append(text);
    };

    if (!current->name.empty())
        addName(current->name);

    if (current->kind == SymbolKind::GenerateBlockArray) {
        auto& array = current->as<GenerateBlockArraySymbol>();
        if (current->name.empty())
            addName(array.getExternalName());
    }
    else if (current->kind == SymbolKind::GenerateBlock) {
        auto& block = current->as<GenerateBlockSymbol>();
        if (auto index = block.arrayIndex) {
            buffer.append("[");
            buffer.append(index->toString(LiteralBase::Decimal, false));
            buffer.append("]");
        }
        else if (current->name.empty()) {
            addName(block.getExternalName());
        }
    }
    else if (current->kind == SymbolKind::Instance ||
             current->kind == SymbolKind::CheckerInstance) {
        auto& inst = current->as<InstanceSymbolBase>();
        if (!inst.arrayPath.empty()) {
            SmallVector<ConstantRange, 8> instanceDimVec;
            inst.getArrayDimensions(instanceDimVec);

            std::span<const ConstantRange> instanceDims = instanceDimVec;
            std::span<const uint32_t> arrayPath = inst.arrayPath;
            SLANG_ASSERT(instanceDims.size() == arrayPath.size());

            for (size_t i = 0; i < instanceDims.size(); i++)
                buffer.format("[{}]", int32_t(arrayPath[i]) + instanceDims[i].lower());
        }
    }
}